

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.h
# Opt level: O3

Element * __thiscall Assimp::FBX::Scope::FindElementCaseInsensitive(Scope *this,string *elementName)

{
  char *__s2;
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var2 = (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->elements)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    __s2 = (elementName->_M_dataplus)._M_p;
    do {
      if (*(char **)(p_Var2 + 1) == (char *)0x0) {
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/StringComparison.h"
                      ,0xba,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)")
        ;
      }
      if (__s2 == (char *)0x0) {
        __assert_fail("__null != s2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/StringComparison.h"
                      ,0xbb,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)")
        ;
      }
      iVar1 = strncasecmp(*(char **)(p_Var2 + 1),__s2,0x400);
      if (iVar1 == 0) {
        return *(Element **)(p_Var2 + 2);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return (Element *)0x0;
}

Assistant:

const Element* FindElementCaseInsensitive(const std::string& elementName) const {
		const char* elementNameCStr = elementName.c_str();
		for (auto element = elements.begin(); element != elements.end(); ++element)
		{
			if (!ASSIMP_strincmp(element->first.c_str(), elementNameCStr, MAXLEN)) {
				return element->second;
			}
		}
		return NULL;
	}